

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts_cache.hpp
# Opt level: O2

vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> * __thiscall
mcts::MCTS_cache<ttt::Board,mcts::RandomPlayout<ttt::Board>>
          (vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *__return_storage_ptr__,
          mcts *this,Board *game,longlong iterations)

{
  pointer pMVar1;
  pointer pfVar2;
  int iVar3;
  mapped_type *pmVar4;
  MCTSResults *r;
  pointer __k;
  __node_base _Var5;
  int iVar6;
  future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *f;
  pointer this_00;
  bool bVar7;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> result;
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  futures;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  um_results;
  
  futures.
  super__Vector_base<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  futures.
  super__Vector_base<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  futures.
  super__Vector_base<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = std::thread::hardware_concurrency();
  iVar6 = 0;
  if (0 < iVar3) {
    iVar6 = iVar3;
  }
  while (pfVar2 = futures.
                  super__Vector_base<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, bVar7 = iVar6 != 0, iVar6 = iVar6 + -1
        , bVar7) {
    um_results._M_h._M_bucket_count =
         CONCAT62(um_results._M_h._M_bucket_count._2_6_,*(undefined2 *)(this + 8));
    um_results._M_h._M_buckets = *(__buckets_ptr *)this;
    um_results._M_h._M_before_begin._M_nxt = (_Hash_node_base *)game;
    std::
    async<mcts::MCTS_cache<ttt::Board,mcts::RandomPlayout<ttt::Board>>(ttt::Board_const&,long_long)::_lambda()_1_>
              ((launch)&result,(anon_class_24_2_cb876266_for__M_head_impl *)0x1);
    std::
    vector<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>,std::allocator<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>>
    ::emplace_back<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>
              ((vector<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>,std::allocator<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>>
                *)&futures,
               (future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *)
               &result);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                _M_impl.super__Vector_impl_data._M_finish);
  }
  um_results._M_h._M_buckets = &um_results._M_h._M_single_bucket;
  um_results._M_h._M_bucket_count = 1;
  um_results._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  um_results._M_h._M_element_count = 0;
  um_results._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  um_results._M_h._M_rehash_policy._M_next_resize = 0;
  um_results._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (this_00 = futures.
                 super__Vector_base<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar2; this_00 = this_00 + 1
      ) {
    std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>::get
              ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
               &result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>,
               this_00);
    pMVar1 = result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (__k = result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
               _M_impl.super__Vector_impl_data._M_start; __k != pMVar1; __k = __k + 1) {
      pmVar4 = std::__detail::
               _Map_base<long,_std::pair<const_long,_std::pair<double,_long_long>_>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_std::pair<double,_long_long>_>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&um_results,&__k->move);
      pmVar4->first = __k->value + pmVar4->first;
      pmVar4->second = pmVar4->second + __k->total;
    }
    std::_Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~_Vector_base
              (&result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>);
  }
  (__return_storage_ptr__->super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (_Var5._M_nxt = um_results._M_h._M_before_begin._M_nxt; _Var5._M_nxt != (_Hash_node_base *)0x0
      ; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
    result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)_Var5._M_nxt[3]._M_nxt;
    result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_Var5._M_nxt[1]._M_nxt;
    result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var5._M_nxt[2]._M_nxt;
    std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>::
    emplace_back<long_const&,double&,long_long&>
              ((vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>> *)__return_storage_ptr__
               ,(long *)&result,
               (double *)
               &result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                _M_impl.super__Vector_impl_data._M_finish,
               (longlong *)
               &result.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Hashtable<long,_std::pair<const_long,_std::pair<double,_long_long>_>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&um_results._M_h);
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::~vector(&futures);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MCTSResults>
MCTS_cache(const IGame &game, long long iterations)
{
    std::vector<std::future<std::vector<MCTSResults>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, iterations] {
            std::unordered_set<GameData<IGame> *, GameDataHash<IGame>, GameDataEqual<IGame>> cache;
            auto game_data = new GameData<IGame>(game);
            cache.insert(game_data);
            for (int i = 0; i < iterations; ++i)
                MCTS_cache_<IGame, RandomPlayout>(cache, game_data);
            std::vector<MCTSResults> results;
            for (auto it : game_data->children)
                results.emplace_back(it.first, it.second->value, it.second->total);
            for (auto it : cache)
                delete it;
            return results;
        }));

    std::unordered_map<game::IMove, std::pair<double, long long>> um_results;
    for (auto &f : futures)
    {
        auto result = f.get();
        for (const auto &r : result)
        {
            auto &p = um_results[r.move];
            p.first += r.value, p.second += r.total;
        }
    }

    std::vector<MCTSResults> results;
    for (auto it : um_results)
        results.emplace_back(it.first, it.second.first, it.second.second);
    return results;
}